

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O1

void Exa_ManExactSynthesis(Bmc_EsPar_t *pPars)

{
  word *pwVar1;
  byte bVar2;
  __time_t _Var3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Exa_Man_t *p;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  int (*paaiVar15) [2] [32];
  bool bVar16;
  int iMint;
  timespec ts_1;
  word pTruth [16];
  uint local_10c;
  timespec local_108;
  uint local_f0;
  int local_ec;
  long local_e8;
  Bmc_EsPar_t *local_e0;
  int (*local_d8) [2] [32];
  int (*local_d0) [2] [32];
  ulong local_c8;
  long local_c0;
  timespec local_b8 [8];
  
  local_10c = 1;
  iVar4 = clock_gettime(3,local_b8);
  if (iVar4 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_b8[0].tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) +
            CONCAT71(local_b8[0].tv_sec._1_7_,(byte)local_b8[0].tv_sec) * -1000000;
  }
  Abc_TtReadHex((word *)local_b8,pPars->pTtStr);
  if (10 < pPars->nVars) {
    __assert_fail("pPars->nVars <= 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                  ,0x327,"void Exa_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  p = Exa_ManAlloc(pPars,(word *)local_b8);
  local_ec = 0;
  if (((byte)local_b8[0].tv_sec & 1) != 0) {
    iVar4 = p->nWords;
    local_ec = 1;
    if (0 < (long)iVar4) {
      lVar8 = 0;
      do {
        (&local_b8[0].tv_sec)[lVar8] = ~(&local_b8[0].tv_sec)[lVar8];
        lVar8 = lVar8 + 1;
      } while (iVar4 != lVar8);
    }
  }
  local_e8 = lVar9;
  iVar4 = Exa_ManAddCnfStart(p,pPars->fOnlyAnd);
  if (iVar4 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                  ,0x32b,"void Exa_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  printf("Running exact synthesis for %d-input function with %d two-input gates...\n",
         (ulong)(uint)p->nVars,(ulong)(uint)p->nNodes);
  if (local_10c != 0xffffffff) {
    local_d8 = p->VarMarks;
    local_f0 = 0;
    local_e0 = pPars;
    do {
      iVar4 = clock_gettime(3,&local_108);
      if (iVar4 < 0) {
        lVar9 = 1;
      }
      else {
        lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_108.tv_nsec),8);
        lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_108.tv_sec * -1000000;
      }
      iVar4 = Exa_ManAddCnf(p,local_10c);
      if (iVar4 == 0) break;
      iVar4 = bmcg_sat_solver_solve(p->pSat,(int *)0x0,0);
      if (pPars->fVerbose != 0) {
        printf("Iter %3d : ",(ulong)local_f0);
        Extra_PrintBinary(_stdout,&local_10c,p->nVars);
        printf("  Var =%5d  ",(ulong)(uint)p->iVar);
        uVar5 = bmcg_sat_solver_clausenum(p->pSat);
        printf("Cla =%6d  ",(ulong)uVar5);
        uVar5 = bmcg_sat_solver_conflictnum(p->pSat);
        printf("Conf =%9d  ",(ulong)uVar5);
        iVar11 = 3;
        iVar6 = clock_gettime(3,&local_108);
        if (iVar6 < 0) {
          lVar8 = -1;
        }
        else {
          lVar8 = local_108.tv_nsec / 1000 + local_108.tv_sec * 1000000;
        }
        Abc_Print(iVar11,"%s =","Time");
        Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar8 + lVar9) / 1000000.0);
      }
      if (iVar4 == 0) {
        printf("The problem timed out after %d sec.\n",(ulong)(uint)pPars->RuntimeLim);
        break;
      }
      if (iVar4 == -1) {
        puts("The problem has no solution.");
        break;
      }
      lVar9 = (long)p->nVars;
      iVar4 = p->nObjs;
      if (p->nVars < iVar4) {
        paaiVar15 = local_d8 + lVar9;
        do {
          local_c8 = (ulong)(uint)(((int)lVar9 - p->nVars) * 3);
          lVar8 = 0;
          local_d0 = paaiVar15;
          local_c0 = lVar9;
          do {
            uVar5 = 0;
            if (p->nObjs < 1) {
              iVar4 = -1;
            }
            else {
              uVar14 = 0xffffffff;
              uVar10 = 0;
              do {
                iVar4 = (*paaiVar15)[0][uVar10];
                if (iVar4 != 0) {
                  iVar4 = bmcg_sat_solver_read_cex_varvalue(p->pSat,iVar4);
                  if (iVar4 != 0) {
                    uVar14 = uVar10 & 0xffffffff;
                  }
                  uVar5 = uVar5 + (iVar4 != 0);
                }
                iVar4 = (int)uVar14;
                uVar10 = uVar10 + 1;
              } while ((long)uVar10 < (long)p->nObjs);
              uVar5 = (uint)(uVar5 == 1);
            }
            if ((char)uVar5 == '\0') {
              __assert_fail("Count == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                            ,0x218,"int Exa_ManFindFanin(Exa_Man_t *, int, int)");
            }
            uVar5 = p->nWords;
            uVar13 = iVar4 * uVar5;
            if ((int)uVar13 < 0) goto LAB_0059c83d;
            iVar4 = p->vInfo->nSize;
            if (iVar4 <= (int)uVar13) goto LAB_0059c83d;
            pwVar1 = p->vInfo->pArray;
            (&local_108.tv_sec)[lVar8] = (__time_t)(pwVar1 + uVar13);
            lVar9 = local_c0;
            uVar10 = local_c8;
            paaiVar15 = (int (*) [2] [32])(*paaiVar15 + 1);
            bVar16 = lVar8 == 0;
            lVar8 = lVar8 + 1;
          } while (bVar16);
          iVar6 = (int)local_c0;
          uVar13 = uVar5 * iVar6;
          if (((int)uVar13 < 0) || (iVar4 <= (int)uVar13)) goto LAB_0059c83d;
          if (0 < (int)uVar5) {
            memset(pwVar1 + uVar13,0,(ulong)uVar5 << 3);
          }
          lVar8 = local_108.tv_nsec;
          _Var3 = local_108.tv_sec;
          uVar5 = 1;
          do {
            iVar4 = bmcg_sat_solver_read_cex_varvalue(p->pSat,uVar5 + (int)uVar10);
            if (iVar4 != 0) {
              uVar13 = p->nWords;
              uVar14 = (ulong)uVar13;
              uVar7 = p->nObjs * uVar13;
              if ((int)uVar7 < 0) goto LAB_0059c83d;
              iVar4 = p->vInfo->nSize;
              if (iVar4 <= (int)uVar7) goto LAB_0059c83d;
              pwVar1 = p->vInfo->pArray;
              if ((uVar5 & 1) == 0) {
                if (uVar5 < 2) {
                  if (0 < (int)uVar13) {
                    uVar12 = 0;
                    do {
                      pwVar1[uVar7 + uVar12] =
                           ~(*(ulong *)(lVar8 + uVar12 * 8) | *(ulong *)(_Var3 + uVar12 * 8));
                      uVar12 = uVar12 + 1;
                    } while (uVar14 != uVar12);
                  }
                }
                else if (0 < (int)uVar13) {
                  uVar12 = 0;
                  do {
                    pwVar1[uVar7 + uVar12] =
                         ~*(ulong *)(_Var3 + uVar12 * 8) & *(ulong *)(lVar8 + uVar12 * 8);
                    uVar12 = uVar12 + 1;
                  } while (uVar14 != uVar12);
                }
              }
              else if (uVar5 < 2) {
                if (0 < (int)uVar13) {
                  uVar12 = 0;
                  do {
                    pwVar1[uVar7 + uVar12] =
                         ~*(ulong *)(lVar8 + uVar12 * 8) & *(ulong *)(_Var3 + uVar12 * 8);
                    uVar12 = uVar12 + 1;
                  } while (uVar14 != uVar12);
                }
              }
              else if (0 < (int)uVar13) {
                uVar12 = 0;
                do {
                  pwVar1[uVar7 + uVar12] =
                       *(ulong *)(lVar8 + uVar12 * 8) & *(ulong *)(_Var3 + uVar12 * 8);
                  uVar12 = uVar12 + 1;
                } while (uVar14 != uVar12);
              }
              if (((int)(uVar13 * iVar6) < 0) || (iVar4 <= (int)(uVar13 * iVar6)))
              goto LAB_0059c83d;
              if (0 < (int)uVar13) {
                uVar12 = 0;
                do {
                  pwVar1[iVar6 * uVar13 + uVar12] =
                       pwVar1[iVar6 * uVar13 + uVar12] | pwVar1[uVar7 + uVar12];
                  uVar12 = uVar12 + 1;
                } while (uVar14 != uVar12);
              }
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != 4);
          lVar9 = lVar9 + 1;
          iVar4 = p->nObjs;
          paaiVar15 = local_d0 + 1;
          pPars = local_e0;
        } while (lVar9 < iVar4);
      }
      uVar5 = (iVar4 + -1) * p->nWords;
      if (((int)uVar5 < 0) || (p->vInfo->nSize <= (int)uVar5)) {
LAB_0059c83d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      bVar2 = (byte)p->nVars;
      uVar13 = 1 << (bVar2 - 6 & 0x1f);
      if (p->nVars < 7) {
        uVar13 = 1;
      }
      uVar7 = 0xffffffff;
      if (0 < (int)uVar13) {
        iVar4 = 0;
        uVar10 = 0;
        do {
          uVar14 = p->vInfo->pArray[uVar5 + uVar10];
          if (uVar14 != p->pTruth[uVar10]) {
            uVar14 = p->pTruth[uVar10] ^ uVar14;
            bVar16 = (int)uVar14 == 0;
            uVar10 = uVar14 >> 0x20;
            if (!bVar16) {
              uVar10 = uVar14;
            }
            iVar11 = (uint)bVar16 * 0x20;
            iVar6 = iVar11 + 0x10;
            uVar14 = uVar10 >> 0x10;
            if ((short)uVar10 != 0) {
              iVar6 = iVar11;
              uVar14 = uVar10;
            }
            iVar11 = iVar6 + 8;
            uVar10 = uVar14 >> 8;
            if ((char)uVar14 != '\0') {
              iVar11 = iVar6;
              uVar10 = uVar14;
            }
            iVar6 = iVar11 + 4;
            uVar14 = uVar10 >> 4;
            if ((uVar10 & 0xf) != 0) {
              iVar6 = iVar11;
              uVar14 = uVar10;
            }
            uVar5 = (uint)(uVar14 >> 2) & 0x3fffffff;
            iVar11 = iVar6 + 2;
            if ((uVar14 & 3) != 0) {
              uVar5 = (uint)uVar14;
              iVar11 = iVar6;
            }
            uVar7 = ((~uVar5 & 1) + iVar11) - iVar4;
            break;
          }
          uVar10 = uVar10 + 1;
          iVar4 = iVar4 + -0x40;
        } while (uVar13 != uVar10);
      }
      if (1 << (bVar2 & 0x1f) <= (int)uVar7) {
        __assert_fail("iMint < (1 << p->nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                      ,0x232,"int Exa_ManEval(Exa_Man_t *)");
      }
      local_f0 = local_f0 + 1;
      local_10c = uVar7;
    } while (uVar7 != 0xffffffff);
  }
  iVar4 = local_ec;
  if (local_10c == 0xffffffff) {
    Exa_ManPrintSolution(p,local_ec);
    Exa_ManDumpBlif(p,iVar4);
  }
  Exa_ManFree(p);
  iVar6 = 3;
  iVar4 = clock_gettime(3,&local_108);
  if (iVar4 < 0) {
    lVar9 = -1;
  }
  else {
    lVar9 = local_108.tv_nsec / 1000 + local_108.tv_sec * 1000000;
  }
  lVar9 = lVar9 + local_e8;
  Abc_Print(iVar6,"%s =","Total runtime");
  Abc_Print(iVar6,"%9.2f sec\n",(double)lVar9 / 1000000.0);
  return;
}

Assistant:

void Exa_ManExactSynthesis( Bmc_EsPar_t * pPars )
{
    int i, status, iMint = 1;
    abctime clkTotal = Abc_Clock();
    Exa_Man_t * p; int fCompl = 0;
    word pTruth[16]; Abc_TtReadHex( pTruth, pPars->pTtStr );
    assert( pPars->nVars <= 10 );
    p = Exa_ManAlloc( pPars, pTruth );
    if ( pTruth[0] & 1 ) { fCompl = 1; Abc_TtNot( pTruth, p->nWords ); }
    status = Exa_ManAddCnfStart( p, pPars->fOnlyAnd );
    assert( status );
    printf( "Running exact synthesis for %d-input function with %d two-input gates...\n", p->nVars, p->nNodes );
    for ( i = 0; iMint != -1; i++ )
    {
        abctime clk = Abc_Clock();
        if ( !Exa_ManAddCnf( p, iMint ) )
            break;
        status = bmcg_sat_solver_solve( p->pSat, NULL, 0 );
        if ( pPars->fVerbose )
        {
            printf( "Iter %3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
            printf( "  Var =%5d  ", p->iVar );
            printf( "Cla =%6d  ", bmcg_sat_solver_clausenum(p->pSat) );
            printf( "Conf =%9d  ", bmcg_sat_solver_conflictnum(p->pSat) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( status == GLUCOSE_UNSAT )
        {
            printf( "The problem has no solution.\n" );
            break;
        }
        if ( status == GLUCOSE_UNDEC )
        {
            printf( "The problem timed out after %d sec.\n", pPars->RuntimeLim );
            break;
        }
        iMint = Exa_ManEval( p );
    }
    if ( iMint == -1 )
    {
        Exa_ManPrintSolution( p, fCompl );
        Exa_ManDumpBlif( p, fCompl );
    }
    Exa_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
}